

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateGroupNonUniformBroadcastShuffle
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint id;
  int32_t iVar4;
  DiagnosticStream *pDVar5;
  DiagnosticStream local_7e8;
  undefined1 local_610 [8];
  string operand_1;
  Op id_op;
  uint id_id;
  bool should_be_constant;
  undefined1 local_408 [8];
  string operand;
  uint32_t id_type_id;
  anon_class_1_0_00000001 GetOperandName;
  undefined1 local_200 [4];
  uint32_t value_type_id;
  uint32_t local_24;
  Instruction *pIStack_20;
  uint32_t type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = val::Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsFloatScalarOrVectorType((ValidationState_t *)inst_local,local_24);
  if (((!bVar1) &&
      (bVar1 = ValidationState_t::IsIntScalarOrVectorType((ValidationState_t *)inst_local,local_24),
      !bVar1)) &&
     (bVar1 = ValidationState_t::IsBoolScalarOrVectorType((ValidationState_t *)inst_local,local_24),
     !bVar1)) {
    ValidationState_t::diag
              ((DiagnosticStream *)local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)local_200,
                        (char (*) [78])
                        "Result must be a scalar or vector of integer, floating-point, or boolean type"
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
    return __local._4_4_;
  }
  uVar2 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,3);
  if (uVar2 != local_24) {
    ValidationState_t::diag
              ((DiagnosticStream *)&id_type_id,(ValidationState_t *)inst_local,
               SPV_ERROR_INVALID_DATA,pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&id_type_id,
                        (char (*) [45])"The type of Value must match the Result type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&id_type_id);
    return __local._4_4_;
  }
  operand.field_2._8_4_ =
       ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,pIStack_20,4);
  bVar1 = ValidationState_t::IsUnsignedIntScalarType
                    ((ValidationState_t *)inst_local,operand.field_2._8_4_);
  if (!bVar1) {
    OVar3 = val::Instruction::opcode(pIStack_20);
    (anonymous_namespace)::
    ValidateGroupNonUniformBroadcastShuffle(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)
    ::$_0::operator()::Op__const((string *)local_408,(void *)((long)&operand.field_2 + 0xf),OVar3);
    ValidationState_t::diag
              ((DiagnosticStream *)&id_id,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               pIStack_20);
    pDVar5 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&id_id,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_408);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [36])0xf4221f);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&id_id);
    std::__cxx11::string::~string((string *)local_408);
    return __local._4_4_;
  }
  OVar3 = val::Instruction::opcode(pIStack_20);
  bVar1 = true;
  if (OVar3 != OpGroupNonUniformQuadSwap) {
    OVar3 = val::Instruction::opcode(pIStack_20);
    if (OVar3 != OpGroupNonUniformBroadcast) {
      OVar3 = val::Instruction::opcode(pIStack_20);
      bVar1 = false;
      if (OVar3 != OpGroupNonUniformQuadBroadcast) goto LAB_00b65fab;
    }
    uVar2 = ValidationState_t::version((ValidationState_t *)inst_local);
    bVar1 = uVar2 < 0x10500;
  }
LAB_00b65fab:
  if (bVar1) {
    id = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,4);
    operand_1.field_2._12_4_ = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,id);
    iVar4 = spvOpcodeIsConstant(operand_1.field_2._12_4_);
    if (iVar4 == 0) {
      OVar3 = val::Instruction::opcode(pIStack_20);
      (anonymous_namespace)::
      ValidateGroupNonUniformBroadcastShuffle(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)
      ::$_0::operator()::Op__const((string *)local_610,(void *)((long)&operand.field_2 + 0xf),OVar3)
      ;
      ValidationState_t::diag
                (&local_7e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar5 = DiagnosticStream::operator<<(&local_7e8,(char (*) [20])"Before SPIR-V 1.5, ");
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_610);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [32])0xf42590);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_7e8);
      std::__cxx11::string::~string((string *)local_610);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateGroupNonUniformBroadcastShuffle(ValidationState_t& _,
                                                     const Instruction* inst) {
  const auto type_id = inst->type_id();
  if (!_.IsFloatScalarOrVectorType(type_id) &&
      !_.IsIntScalarOrVectorType(type_id) &&
      !_.IsBoolScalarOrVectorType(type_id)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a scalar or vector of integer, floating-point, "
              "or boolean type";
  }

  const auto value_type_id = _.GetOperandTypeId(inst, 3);
  if (value_type_id != type_id) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The type of Value must match the Result type";
  }

  const auto GetOperandName = [](const spv::Op opcode) {
    std::string operand;
    switch (opcode) {
      case spv::Op::OpGroupNonUniformBroadcast:
      case spv::Op::OpGroupNonUniformShuffle:
        operand = "Id";
        break;
      case spv::Op::OpGroupNonUniformShuffleXor:
        operand = "Mask";
        break;
      case spv::Op::OpGroupNonUniformQuadBroadcast:
        operand = "Index";
        break;
      case spv::Op::OpGroupNonUniformQuadSwap:
        operand = "Direction";
        break;
      case spv::Op::OpGroupNonUniformShuffleUp:
      case spv::Op::OpGroupNonUniformShuffleDown:
      default:
        operand = "Delta";
        break;
    }
    return operand;
  };

  const auto id_type_id = _.GetOperandTypeId(inst, 4);
  if (!_.IsUnsignedIntScalarType(id_type_id)) {
    std::string operand = GetOperandName(inst->opcode());
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << operand << " must be an unsigned integer scalar";
  }

  const bool should_be_constant =
      inst->opcode() == spv::Op::OpGroupNonUniformQuadSwap ||
      ((inst->opcode() == spv::Op::OpGroupNonUniformBroadcast ||
        inst->opcode() == spv::Op::OpGroupNonUniformQuadBroadcast) &&
       _.version() < SPV_SPIRV_VERSION_WORD(1, 5));
  if (should_be_constant) {
    const auto id_id = inst->GetOperandAs<uint32_t>(4);
    const auto id_op = _.GetIdOpcode(id_id);
    if (!spvOpcodeIsConstant(id_op)) {
      std::string operand = GetOperandName(inst->opcode());
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Before SPIR-V 1.5, " << operand
             << " must be a constant instruction";
    }
  }

  return SPV_SUCCESS;
}